

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear
          (MessageGenerator *this,FieldDescriptor *field,bool is_inline,Formatter *format)

{
  bool bVar1;
  int iVar2;
  OneofDescriptor *pOVar3;
  FieldGenerator *pFVar4;
  undefined7 in_register_00000011;
  char *format_00;
  allocator local_51;
  string local_50;
  Hex local_30;
  
  if ((int)CONCAT71(in_register_00000011,is_inline) != 0) {
    Formatter::operator()<>(format,"inline ");
  }
  Formatter::operator()<>(format,"void $classname$::clear_$name$() {\n");
  Formatter::Indent(format);
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar4->_vptr_FieldGenerator[10])(pFVar4,format->printer_);
    bVar1 = HasHasbit(field);
    if (!bVar1) goto LAB_002d5e88;
    iVar2 = HasBitIndex(this,field);
    std::__cxx11::string::string((string *)&local_50,"has_array_index",&local_51);
    local_30.value = CONCAT44(local_30.value._4_4_,iVar2 / 0x20);
    Formatter::Set<int>(format,&local_50,(int *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"has_mask",&local_51);
    local_30.value = (uint64)(uint)(1 << ((byte)iVar2 & 0x1f));
    local_30.spec = ZERO_PAD_8;
    Formatter::Set<google::protobuf::strings::Hex>(format,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    format_00 = "_has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n";
  }
  else {
    Formatter::operator()<>(format,"if (_internal_has_$name$()) {\n");
    Formatter::Indent(format);
    pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar4->_vptr_FieldGenerator[10])(pFVar4,format->printer_);
    Formatter::operator()<>(format,"clear_has_$oneof_name$();\n");
    Formatter::Outdent(format);
    format_00 = "}\n";
  }
  Formatter::operator()<>(format,format_00);
LAB_002d5e88:
  Formatter::operator()<>(format,"$annotate_clear$");
  Formatter::Outdent(format);
  Formatter::operator()<>(format,"}\n");
  return;
}

Assistant:

void MessageGenerator::GenerateFieldClear(const FieldDescriptor* field,
                                          bool is_inline, Formatter format) {
  if (IsFieldStripped(field, options_)) {
    format("void $classname$::clear_$name$() { __builtin_trap(); }\n");
    return;
  }

  // Generate clear_$name$().
  if (is_inline) {
    format("inline ");
  }
  format("void $classname$::clear_$name$() {\n");

  format.Indent();

  if (field->real_containing_oneof()) {
    // Clear this field only if it is the active field in this oneof,
    // otherwise ignore
    format("if (_internal_has_$name$()) {\n");
    format.Indent();
    field_generators_.get(field).GenerateClearingCode(format.printer());
    format("clear_has_$oneof_name$();\n");
    format.Outdent();
    format("}\n");
  } else {
    field_generators_.get(field).GenerateClearingCode(format.printer());
    if (HasHasbit(field)) {
      int has_bit_index = HasBitIndex(field);
      format.Set("has_array_index", has_bit_index / 32);
      format.Set("has_mask",
                 strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
      format("_has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n");
    }
  }
  format("$annotate_clear$");
  format.Outdent();
  format("}\n");
}